

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Precedence binop_prec(Tk binop)

{
  if (binop < 0x100) {
    switch(binop) {
    case 0x2a:
    case 0x2f:
      return PREC_MUL;
    case 0x2b:
    case 0x2d:
      return PREC_ADD;
    case 0x2c:
    case 0x2e:
      break;
    default:
      if (binop == 0x3c) {
        return PREC_ORD;
      }
      if (binop == 0x3e) {
        return PREC_ORD;
      }
    }
  }
  else {
    switch(binop) {
    case 0x100:
      return PREC_CONCAT;
    case 0x106:
    case 0x107:
      return PREC_EQ;
    case 0x108:
    case 0x109:
      return PREC_ORD;
    case 0x10a:
      return PREC_AND;
    case 0x10b:
      return PREC_OR;
    }
  }
  return PREC_NOT_FOUND;
}

Assistant:

static Precedence binop_prec(Tk binop) {
	switch (binop) {
	case TK_OR:
		return PREC_OR;
	case TK_AND:
		return PREC_AND;
	case TK_EQ: case TK_NEQ:
		return PREC_EQ;
	case '>': case '<': case TK_GE: case TK_LE:
		return PREC_ORD;
	case TK_CONCAT:
		return PREC_CONCAT;
	case '+': case '-':
		return PREC_ADD;
	case '*': case '/':
		return PREC_MUL;
	default:
		return PREC_NOT_FOUND;
	}
}